

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

String * format<char>(String *__return_storage_ptr__,String *fmtstr,char *raw_args)

{
  size_type sVar1;
  unsigned_long local_58;
  size_type local_50 [3];
  undefined1 local_38 [8];
  vector<String,_std::allocator<String>_> args;
  char *raw_args_local;
  String *fmtstr_local;
  
  args.super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)raw_args;
  std::vector<String,_std::allocator<String>_>::vector
            ((vector<String,_std::allocator<String>_> *)local_38);
  expandFormatArguments<char>
            ((vector<String,_std::allocator<String>_> *)local_38,
             (char *)args.super__Vector_base<String,_std::allocator<String>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  sVar1 = std::vector<String,_std::allocator<String>_>::size
                    ((vector<String,_std::allocator<String>_> *)local_38);
  if (sVar1 != 1) {
    local_50[0] = std::vector<String,_std::allocator<String>_>::size
                            ((vector<String,_std::allocator<String>_> *)local_38);
    local_58 = 1;
    error<unsigned_long,unsigned_long>
              ("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/format.h:200: args.size() (%1) does not equal sizeof... (raw_args) (%2)"
               ,local_50,&local_58);
  }
  formatArgs(__return_storage_ptr__,fmtstr,(vector<String,_std::allocator<String>_> *)local_38);
  std::vector<String,_std::allocator<String>_>::~vector
            ((vector<String,_std::allocator<String>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

String format (const String& fmtstr, const argtypes&... raw_args)
{
	std::vector<String> args;
	expandFormatArguments (args, raw_args...);
	ASSERT_EQ (args.size(), sizeof... (raw_args))
	return formatArgs (fmtstr, args);
}